

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_environment_setNewSymbolBindingWithValueAndFlagsAtSourcePosition
          (sysbvm_context_t *context,sysbvm_tuple_t environment,sysbvm_tuple_t symbol,
          sysbvm_tuple_t value,_Bool isMutable,_Bool isExternal,_Bool isThreadLocal,
          sysbvm_tuple_t sourcePosition)

{
  _Bool _Var1;
  sysbvm_tuple_t binding_00;
  sysbvm_tuple_t binding;
  _Bool isThreadLocal_local;
  _Bool isExternal_local;
  _Bool isMutable_local;
  sysbvm_tuple_t value_local;
  sysbvm_tuple_t symbol_local;
  sysbvm_tuple_t environment_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(environment);
  if (!_Var1) {
    sysbvm_error("Expected an environment.");
  }
  binding_00 = sysbvm_symbolValueBinding_createWithFlags
                         (context,sourcePosition,symbol,value,isMutable,isExternal,isThreadLocal);
  sysbvm_environment_setNewBinding(context,environment,binding_00);
  return binding_00;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_environment_setNewSymbolBindingWithValueAndFlagsAtSourcePosition(sysbvm_context_t *context, sysbvm_tuple_t environment, sysbvm_tuple_t symbol, sysbvm_tuple_t value, bool isMutable, bool isExternal, bool isThreadLocal, sysbvm_tuple_t sourcePosition)
{
    if(!sysbvm_tuple_isNonNullPointer(environment))
        sysbvm_error("Expected an environment.");

    sysbvm_tuple_t binding = sysbvm_symbolValueBinding_createWithFlags(context, sourcePosition, symbol, value, isMutable, isExternal, isThreadLocal);
    sysbvm_environment_setNewBinding(context, environment, binding);
    return binding;
}